

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  float *pfVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImDrawVert *pIVar5;
  ImVec4 *pIVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  ImDrawIdx IVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ImDrawIdx *pIVar16;
  byte bVar17;
  ImDrawIdx IVar18;
  ImDrawIdx IVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  ulong uVar22;
  ImDrawIdx IVar23;
  float fVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float afStack_b8 [2];
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  ImVec2 IStack_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ulong local_88;
  ulong local_80;
  float local_78;
  ulong local_60;
  int local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  uint local_38;
  byte local_31;
  
  if (points_count < 2) {
    return;
  }
  local_88 = (ulong)(uint)points_count;
  local_80 = (ulong)(points_count - 1U);
  IVar4 = this->_Data->TexUvWhitePixel;
  uVar13 = points_count;
  if ((flags & 1U) == 0) {
    uVar13 = points_count - 1U;
  }
  local_98.x = thickness;
  local_48 = local_88;
  if ((this->Flags & 1U) == 0) {
    uStack_b0 = 0x123541;
    PrimReserve(this,uVar13 * 6,uVar13 << 2);
    for (uVar9 = 1; uVar9 - uVar13 != 1; uVar9 = uVar9 + 1) {
      uVar14 = uVar9 & 0xffffffff;
      if (local_48 == uVar9) {
        uVar14 = 0;
      }
      fVar24 = points[uVar9 - 1].x;
      fVar26 = points[uVar14].x - fVar24;
      fVar31 = points[uVar9 - 1].y;
      auVar28._4_4_ = points[uVar14].y - fVar31;
      auVar28._0_4_ = fVar26 * fVar26 + auVar28._4_4_ * auVar28._4_4_;
      auVar28._8_8_ = 0;
      if (0.0 < auVar28._0_4_) {
        auVar29 = rsqrtss(auVar28,auVar28);
        auVar28._4_4_ = auVar28._4_4_ * auVar29._0_4_;
        fVar26 = fVar26 * auVar29._0_4_;
      }
      auVar28._4_4_ = auVar28._4_4_ * local_98.x * 0.5;
      fVar26 = fVar26 * local_98.x * 0.5;
      pIVar5 = this->_VtxWritePtr;
      IVar25.y = fVar31 - fVar26;
      IVar25.x = fVar24 + auVar28._4_4_;
      pIVar5->pos = IVar25;
      pIVar5->uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos.x = points[uVar14].x + auVar28._4_4_;
      pIVar5[1].pos.y = points[uVar14].y - fVar26;
      pIVar5[1].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = col;
      pIVar5[2].pos.x = points[uVar14].x - auVar28._4_4_;
      pIVar5[2].pos.y = points[uVar14].y + fVar26;
      pIVar5[2].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[2].col = col;
      pIVar5[3].pos.x = points[uVar9 - 1].x - auVar28._4_4_;
      pIVar5[3].pos.y = points[uVar9 - 1].y + fVar26;
      pIVar5[3].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[3].col = col;
      this->_VtxWritePtr = pIVar5 + 4;
      uVar21 = this->_VtxCurrentIdx;
      pIVar16 = this->_IdxWritePtr;
      IVar12 = (ImDrawIdx)uVar21;
      *pIVar16 = IVar12;
      pIVar16[1] = IVar12 + 1;
      pIVar16[2] = IVar12 + 2;
      pIVar16[3] = IVar12;
      pIVar16[4] = IVar12 + 2;
      pIVar16[5] = IVar12 + 3;
      this->_IdxWritePtr = pIVar16 + 6;
      this->_VtxCurrentIdx = uVar21 + 4;
    }
    return;
  }
  local_78 = thickness;
  if (thickness <= 1.0) {
    local_78 = 1.0;
  }
  local_4c = (int)local_78;
  auVar28._4_4_ = this->_FringeScale;
  local_31 = auVar28._4_4_ == 1.0 & local_4c < 0x3f & (byte)this->Flags >> 1 &
             local_78 - (float)local_4c <= 1e-05;
  iVar7 = 0x12;
  if (thickness <= auVar28._4_4_) {
    iVar7 = 0xc;
  }
  iVar8 = 6;
  if (local_31 == 0) {
    iVar8 = iVar7;
  }
  _local_a8 = ZEXT416((uint)auVar28._4_4_);
  if (local_31 == 1) {
    local_54 = points_count * 2;
    local_60 = 3;
  }
  else {
    local_54 = points_count * 3;
    if (auVar28._4_4_ < thickness) {
      local_54 = points_count * 4;
    }
    local_60 = (ulong)((uint)(auVar28._4_4_ < thickness) * 2 + 3);
  }
  local_38 = col & 0xffffff;
  uStack_b0 = 0x12377f;
  local_50 = flags;
  local_40 = (ulong)uVar13;
  PrimReserve(this,iVar8 * uVar13,local_54);
  uVar14 = local_48;
  lVar11 = -((ulong)(uint)((int)local_60 * (int)local_88) * 8 + 0xf & 0xfffffffffffffff0);
  puVar10 = (undefined8 *)(local_a8 + lVar11);
  uVar22 = -local_40;
  for (uVar9 = 1; uVar22 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar15 = uVar9 & 0xffffffff;
    if (uVar14 == uVar9) {
      uVar15 = 0;
    }
    auVar28._4_4_ = points[uVar15].x - points[uVar9 - 1].x;
    fVar26 = points[uVar15].y - points[uVar9 - 1].y;
    auVar29._0_4_ = auVar28._4_4_ * auVar28._4_4_ + fVar26 * fVar26;
    auVar29._4_4_ = fVar26;
    auVar29._8_8_ = 0;
    if (0.0 < auVar29._0_4_) {
      auVar29 = rsqrtss(auVar29,auVar29);
      auVar28._4_4_ = auVar28._4_4_ * auVar29._0_4_;
      fVar26 = fVar26 * auVar29._0_4_;
    }
    *(float *)(local_a8 + uVar9 * 8 + lVar11 + -8) = fVar26;
    *(float *)(local_a8 + uVar9 * 8 + lVar11 + -4) = -auVar28._4_4_;
  }
  pfVar1 = (float *)(puVar10 + uVar14);
  local_40 = uVar22;
  auVar28._4_4_ = (float)local_a8._0_4_;
  if ((local_50 & 1) == 0) {
    uVar9 = local_80 & 0xffffffff;
    puVar10[uVar9] = *(undefined8 *)(pfVar1 + -4);
    bVar17 = local_31;
    if ((float)local_a8._0_4_ < local_98.x && local_31 == 0) {
      auVar28._4_4_ = (local_78 - (float)local_a8._0_4_) * 0.5;
      fVar26 = (float)local_a8._0_4_ + auVar28._4_4_;
      fVar24 = (float)*puVar10;
      fVar27 = fVar26 * fVar24;
      fVar31 = (float)((ulong)*puVar10 >> 0x20);
      fVar30 = fVar26 * fVar31;
      fVar32 = (*points).x;
      fVar33 = (*points).y;
      fVar24 = fVar24 * auVar28._4_4_;
      fVar31 = fVar31 * auVar28._4_4_;
      *pfVar1 = fVar27 + fVar32;
      pfVar1[1] = fVar30 + fVar33;
      pfVar1[2] = fVar24 + fVar32;
      pfVar1[3] = fVar31 + fVar33;
      pfVar1[4] = fVar32 - fVar24;
      pfVar1[5] = fVar33 - fVar31;
      pfVar1[6] = fVar32 - fVar27;
      pfVar1[7] = fVar33 - fVar30;
      fVar24 = points[uVar9].x;
      fVar31 = points[uVar9].y;
      uVar15 = (ulong)(uint)((int)local_80 << 2);
      *(ulong *)(pfVar1 + uVar15 * 2) =
           CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar26 + fVar31,
                    (float)puVar10[uVar9] * fVar26 + fVar24);
      *(ulong *)(pfVar1 + uVar15 * 2 + 2) =
           CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * auVar28._4_4_ + fVar31,
                    (float)puVar10[uVar9] * auVar28._4_4_ + fVar24);
      *(ulong *)(pfVar1 + uVar15 * 2 + 4) =
           CONCAT44(fVar31 - (float)((ulong)puVar10[uVar9] >> 0x20) * auVar28._4_4_,
                    fVar24 - (float)puVar10[uVar9] * auVar28._4_4_);
      *(ulong *)(pfVar1 + uVar15 * 2 + 6) =
           CONCAT44(fVar31 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar26,
                    fVar24 - (float)puVar10[uVar9] * fVar26);
LAB_00123b94:
      uVar13 = this->_VtxCurrentIdx;
      pIVar16 = this->_IdxWritePtr;
      *(undefined8 *)(local_a8 + lVar11 + -8) = 1;
      for (uVar9 = *(ulong *)(local_a8 + lVar11 + -8); uVar22 + uVar9 != 1; uVar9 = uVar9 + 1) {
        uVar22 = uVar9 & 0xffffffff;
        if (uVar14 == uVar9) {
          uVar22 = 0;
        }
        uVar21 = uVar13 + 4;
        if (uVar14 == uVar9) {
          uVar21 = this->_VtxCurrentIdx;
        }
        fVar24 = ((float)puVar10[uVar22] +
                 (float)*(undefined8 *)(local_a8 + uVar9 * 8 + lVar11 + -8)) * 0.5;
        fVar31 = ((float)((ulong)puVar10[uVar22] >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_a8 + uVar9 * 8 + lVar11 + -8) >> 0x20)) * 0.5;
        fVar27 = fVar24 * fVar24 + fVar31 * fVar31;
        if (1e-06 < fVar27) {
          fVar27 = 1.0 / fVar27;
          fVar30 = 100.0;
          if (fVar27 <= 100.0) {
            fVar30 = fVar27;
          }
          fVar24 = fVar24 * fVar30;
          fVar31 = fVar31 * fVar30;
        }
        uVar14 = (ulong)(uint)((int)uVar22 * 4);
        fVar27 = points[uVar22].x;
        fVar30 = points[uVar22].y;
        pfVar2 = pfVar1 + uVar14 * 2;
        *pfVar2 = fVar24 * fVar26 + fVar27;
        pfVar2[1] = fVar31 * fVar26 + fVar30;
        pfVar2[2] = fVar24 * auVar28._4_4_ + fVar27;
        pfVar2[3] = fVar31 * auVar28._4_4_ + fVar30;
        pfVar2 = pfVar1 + uVar14 * 2 + 4;
        *pfVar2 = fVar27 - fVar24 * auVar28._4_4_;
        pfVar2[1] = fVar30 - fVar31 * auVar28._4_4_;
        pfVar2[2] = fVar27 - fVar24 * fVar26;
        pfVar2[3] = fVar30 - fVar31 * fVar26;
        IVar12 = (ImDrawIdx)uVar21;
        IVar19 = IVar12 + 1;
        *pIVar16 = IVar19;
        IVar20 = (ImDrawIdx)uVar13;
        pIVar16[1] = IVar20 + 1;
        IVar23 = IVar20 + 2;
        pIVar16[2] = IVar23;
        pIVar16[3] = IVar23;
        IVar18 = IVar12 + 2;
        pIVar16[4] = IVar18;
        pIVar16[5] = IVar19;
        pIVar16[6] = IVar19;
        pIVar16[7] = IVar20 + 1;
        pIVar16[8] = IVar20;
        pIVar16[9] = IVar20;
        pIVar16[10] = IVar12;
        pIVar16[0xb] = IVar19;
        pIVar16[0xc] = IVar18;
        pIVar16[0xd] = IVar23;
        pIVar16[0xe] = IVar20 + 3;
        pIVar16[0xf] = IVar20 + 3;
        pIVar16[0x10] = IVar12 + 3;
        pIVar16[0x11] = IVar18;
        pIVar16 = pIVar16 + 0x12;
        this->_IdxWritePtr = pIVar16;
        uVar14 = local_48;
        uVar22 = local_40;
        uVar13 = uVar21;
      }
      for (lVar11 = 0; uVar14 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8);
        this->_VtxWritePtr->uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = local_38;
        pIVar5[1].pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8 + 8);
        this->_VtxWritePtr[1].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[1].col = col;
        pIVar5[2].pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8 + 0x10);
        this->_VtxWritePtr[2].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[2].col = col;
        pIVar5[3].pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8 + 0x18);
        this->_VtxWritePtr[3].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[3].col = local_38;
        this->_VtxWritePtr = pIVar5 + 4;
      }
      goto LAB_00123ddb;
    }
    if (local_31 != 0) {
      auVar28._4_4_ = local_78 * 0.5 + 1.0;
    }
    fVar26 = (float)*puVar10 * auVar28._4_4_;
    fVar24 = (float)((ulong)*puVar10 >> 0x20) * auVar28._4_4_;
    fVar31 = (*points).x;
    fVar27 = (*points).y;
    *(ulong *)pfVar1 = CONCAT44(fVar24 + fVar27,fVar26 + fVar31);
    *(ulong *)(pfVar1 + 2) = CONCAT44(fVar27 - fVar24,fVar31 - fVar26);
    fVar26 = points[uVar9].x;
    fVar24 = points[uVar9].y;
    uVar15 = (ulong)(uint)((int)local_80 * 2);
    *(ulong *)(pfVar1 + uVar15 * 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * auVar28._4_4_ + fVar24,
                  (float)puVar10[uVar9] * auVar28._4_4_ + fVar26);
    *(ulong *)(pfVar1 + uVar15 * 2 + 2) =
         CONCAT44(fVar24 - (float)((ulong)puVar10[uVar9] >> 0x20) * auVar28._4_4_,
                  fVar26 - (float)puVar10[uVar9] * auVar28._4_4_);
  }
  else {
    if ((local_98.x <= (float)local_a8._0_4_ | local_31) != 1) {
      auVar28._4_4_ = (local_78 - (float)local_a8._0_4_) * 0.5;
      fVar26 = (float)local_a8._0_4_ + auVar28._4_4_;
      goto LAB_00123b94;
    }
    bVar17 = local_31;
    if (local_31 != 0) {
      auVar28._4_4_ = local_78 * 0.5 + 1.0;
    }
  }
  uVar13 = this->_VtxCurrentIdx;
  pIVar16 = this->_IdxWritePtr;
  *(undefined8 *)(local_a8 + lVar11 + -8) = 1;
  for (uVar9 = *(ulong *)(local_a8 + lVar11 + -8); uVar22 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar22 = uVar9 & 0xffffffff;
    if (uVar14 == uVar9) {
      uVar22 = 0;
    }
    uVar21 = uVar13 + (bVar17 ^ 3);
    if (uVar14 == uVar9) {
      uVar21 = this->_VtxCurrentIdx;
    }
    fVar26 = ((float)puVar10[uVar22] + (float)*(undefined8 *)(local_a8 + uVar9 * 8 + lVar11 + -8)) *
             0.5;
    fVar24 = ((float)((ulong)puVar10[uVar22] >> 0x20) +
             (float)((ulong)*(undefined8 *)(local_a8 + uVar9 * 8 + lVar11 + -8) >> 0x20)) * 0.5;
    fVar31 = fVar26 * fVar26 + fVar24 * fVar24;
    if (1e-06 < fVar31) {
      fVar31 = 1.0 / fVar31;
      fVar27 = 100.0;
      if (fVar31 <= 100.0) {
        fVar27 = fVar31;
      }
      fVar26 = fVar26 * fVar27;
      fVar24 = fVar24 * fVar27;
    }
    fVar31 = points[uVar22].x;
    fVar27 = points[uVar22].y;
    pfVar2 = pfVar1 + (ulong)(uint)((int)uVar22 * 2) * 2;
    *pfVar2 = fVar26 * auVar28._4_4_ + fVar31;
    pfVar2[1] = fVar24 * auVar28._4_4_ + fVar27;
    pfVar2[2] = fVar31 - fVar26 * auVar28._4_4_;
    pfVar2[3] = fVar27 - fVar24 * auVar28._4_4_;
    IVar20 = (ImDrawIdx)uVar21;
    *pIVar16 = IVar20;
    IVar12 = (ImDrawIdx)uVar13;
    pIVar16[1] = IVar12;
    if (local_31 == 0) {
      pIVar16[2] = IVar12 + 2;
      pIVar16[3] = IVar12 + 2;
      pIVar16[4] = IVar20 + 2;
      pIVar16[5] = IVar20;
      pIVar16[6] = IVar20 + 1;
      pIVar16[7] = IVar12 + 1;
      pIVar16[8] = IVar12;
      pIVar16[9] = IVar12;
      pIVar16[10] = IVar20;
      pIVar16[0xb] = IVar20 + 1;
      *(undefined8 *)(local_a8 + lVar11 + -8) = 0x18;
    }
    else {
      pIVar16[2] = IVar12 + 1;
      pIVar16[3] = IVar20 + 1;
      pIVar16[4] = IVar12 + 1;
      pIVar16[5] = IVar20;
      *(undefined8 *)(local_a8 + lVar11 + -8) = 0xc;
    }
    pIVar16 = (ImDrawIdx *)((long)pIVar16 + *(long *)(local_a8 + lVar11 + -8));
    this->_IdxWritePtr = pIVar16;
    uVar14 = local_48;
    uVar22 = local_40;
    uVar13 = uVar21;
  }
  if (local_31 == 0) {
    for (lVar11 = 0; uVar14 * 8 - lVar11 != 0; lVar11 = lVar11 + 8) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar11);
      this->_VtxWritePtr->uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos = *(ImVec2 *)((long)puVar10 + lVar11 * 2 + uVar14 * 8);
      this->_VtxWritePtr[1].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = local_38;
      pIVar5[2].pos = *(ImVec2 *)((long)puVar10 + lVar11 * 2 + uVar14 * 8 + 8);
      this->_VtxWritePtr[2].uv = IVar4;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[2].col = local_38;
      this->_VtxWritePtr = pIVar5 + 3;
    }
  }
  else {
    pIVar6 = this->_Data->TexUvLines;
    pIVar3 = pIVar6 + local_4c;
    auVar28._4_4_ = pIVar3->x;
    fVar26 = pIVar3->y;
    pIVar6 = pIVar6 + local_4c;
    fVar24 = pIVar6->z;
    fVar31 = pIVar6->w;
    for (lVar11 = 0; uVar14 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8);
      pIVar5 = this->_VtxWritePtr;
      (pIVar5->uv).x = auVar28._4_4_;
      (pIVar5->uv).y = fVar26;
      pIVar5 = this->_VtxWritePtr;
      pIVar5->col = col;
      pIVar5[1].pos = *(ImVec2 *)((long)puVar10 + lVar11 + uVar14 * 8 + 8);
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].uv.x = fVar24;
      pIVar5[1].uv.y = fVar31;
      pIVar5 = this->_VtxWritePtr;
      pIVar5[1].col = col;
      this->_VtxWritePtr = pIVar5 + 2;
    }
  }
LAB_00123ddb:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_54;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}